

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_number(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this)

{
  pointer *ppcVar1;
  int iVar2;
  char cVar3;
  int_type iVar4;
  token_type tVar5;
  int *piVar6;
  ulonglong uVar7;
  longlong lVar8;
  char *pcVar9;
  int iVar10;
  double dVar11;
  char *endptr;
  char *local_28;
  
  reset(this);
  iVar2 = this->current;
  iVar10 = 5;
  cVar3 = (char)this;
  if (iVar2 - 0x31U < 9) {
LAB_001619d3:
    do {
      std::__cxx11::string::push_back(cVar3 + '8');
      iVar4 = get(this);
    } while (iVar4 - 0x30U < 10);
    if (iVar4 == 0x2e) {
LAB_00161b17:
      std::__cxx11::string::push_back(cVar3 + '8');
      iVar4 = get(this);
      if (9 < iVar4 - 0x30U) {
        pcVar9 = "invalid number; expected digit after \'.\'";
        goto LAB_00161c03;
      }
      do {
        std::__cxx11::string::push_back(cVar3 + '8');
        iVar4 = get(this);
      } while (iVar4 - 0x30U < 10);
      if ((iVar4 == 0x65) || (iVar4 == 0x45)) goto LAB_00161b6b;
      iVar10 = 7;
    }
    else if ((iVar4 == 0x45) || (iVar4 == 0x65)) {
LAB_00161b6b:
      std::__cxx11::string::push_back(cVar3 + '8');
      iVar4 = get(this);
      if (9 < iVar4 - 0x30U) {
        if ((iVar4 == 0x2d) || (iVar4 == 0x2b)) {
          std::__cxx11::string::push_back(cVar3 + '8');
          iVar4 = get(this);
          if (iVar4 - 0x30U < 10) goto LAB_00161b9e;
          pcVar9 = "invalid number; expected digit after exponent sign";
        }
        else {
          pcVar9 = "invalid number; expected \'+\', \'-\', or digit after exponent";
        }
        goto LAB_00161c03;
      }
LAB_00161b9e:
      std::__cxx11::string::push_back(cVar3 + '8');
      iVar4 = get(this);
      iVar10 = 7;
      if (iVar4 - 0x30U < 10) {
        lexer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
        ::scan_number();
      }
    }
LAB_00161a13:
    this->next_unget = true;
    this->chars_read = this->chars_read - 1;
    if (this->current != -1) {
      ppcVar1 = &(this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + -1;
    }
    local_28 = (char *)0x0;
    piVar6 = __errno_location();
    *piVar6 = 0;
    if (iVar10 == 6) {
      lVar8 = strtoll((this->token_buffer)._M_dataplus._M_p,&local_28,10);
      if (*piVar6 == 0) {
        this->value_integer = lVar8;
        return value_integer;
      }
    }
    else if ((iVar10 == 5) &&
            (uVar7 = strtoull((this->token_buffer)._M_dataplus._M_p,&local_28,10), *piVar6 == 0)) {
      this->value_unsigned = uVar7;
      return value_unsigned;
    }
    dVar11 = strtod((this->token_buffer)._M_dataplus._M_p,&local_28);
    this->value_float = dVar11;
    tVar5 = value_float;
  }
  else {
    if (iVar2 == 0x30) {
      std::__cxx11::string::push_back(cVar3 + '8');
      iVar10 = 5;
LAB_00161af6:
      iVar4 = get(this);
      if (iVar4 != 0x2e) {
        if ((iVar4 == 0x65) || (iVar4 == 0x45)) goto LAB_00161b6b;
        goto LAB_00161a13;
      }
      goto LAB_00161b17;
    }
    if (iVar2 == 0x2d) {
      std::__cxx11::string::push_back(cVar3 + '8');
    }
    iVar4 = get(this);
    if (iVar4 - 0x31U < 9) {
      iVar10 = 6;
      goto LAB_001619d3;
    }
    if (iVar4 == 0x30) {
      std::__cxx11::string::push_back(cVar3 + '8');
      iVar10 = 6;
      goto LAB_00161af6;
    }
    pcVar9 = "invalid number; expected digit after \'-\'";
LAB_00161c03:
    this->error_message = pcVar9;
    tVar5 = parse_error;
  }
  return tVar5;
}

Assistant:

token_type scan_number()
    {
        // reset token_buffer to store the number's bytes
        reset();

        // the type of the parsed number; initially set to unsigned; will be
        // changed if minus sign, decimal point or exponent is read
        token_type number_type = token_type::value_unsigned;

        // state (init): we just found out we need to scan a number
        switch (current)
        {
            case '-':
            {
                add(current);
                goto scan_number_minus;
            }

            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            // LCOV_EXCL_START
            default:
            {
                // all other characters are rejected outside scan_number()
                assert(false);
            }
                // LCOV_EXCL_STOP
        }

scan_number_minus:
        // state: we just parsed a leading minus sign
        number_type = token_type::value_integer;
        switch (get())
        {
            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                error_message = "invalid number; expected digit after '-'";
                return token_type::parse_error;
            }
        }

scan_number_zero:
        // state: we just parse a zero (maybe with a leading minus sign)
        switch (get())
        {
            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_any1:
        // state: we just parsed a number 0-9 (maybe with a leading minus sign)
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_decimal1:
        // state: we just parsed a decimal point
        number_type = token_type::value_float;
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            default:
            {
                error_message = "invalid number; expected digit after '.'";
                return token_type::parse_error;
            }
        }

scan_number_decimal2:
        // we just parsed at least one number after a decimal point
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_exponent:
        // we just parsed an exponent
        number_type = token_type::value_float;
        switch (get())
        {
            case '+':
            case '-':
            {
                add(current);
                goto scan_number_sign;
            }

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message =
                    "invalid number; expected '+', '-', or digit after exponent";
                return token_type::parse_error;
            }
        }

scan_number_sign:
        // we just parsed an exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message = "invalid number; expected digit after exponent sign";
                return token_type::parse_error;
            }
        }

scan_number_any2:
        // we just parsed a number after the exponent or exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
                goto scan_number_done;
        }

scan_number_done:
        // unget the character after the number (we only read it to know that
        // we are done scanning a number)
        unget();

        char* endptr = nullptr;
        errno = 0;

        // try to parse integers first and fall back to floats
        if (number_type == token_type::value_unsigned)
        {
            const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_unsigned = static_cast<number_unsigned_t>(x);
                if (value_unsigned == x)
                {
                    return token_type::value_unsigned;
                }
            }
        }
        else if (number_type == token_type::value_integer)
        {
            const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_integer = static_cast<number_integer_t>(x);
                if (value_integer == x)
                {
                    return token_type::value_integer;
                }
            }
        }

        // this code is reached if we parse a floating-point number or if an
        // integer conversion above failed
        strtof(value_float, token_buffer.data(), &endptr);

        // we checked the number format before
        assert(endptr == token_buffer.data() + token_buffer.size());

        return token_type::value_float;
    }